

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O0

void __thiscall aeron::BufferBuilder::BufferBuilder(BufferBuilder *this,uint32_t initialLength)

{
  uint uVar1;
  uchar *__p;
  uint32_t initialLength_local;
  BufferBuilder *this_local;
  
  this->_vptr_BufferBuilder = (_func_int **)&PTR__BufferBuilder_00226240;
  uVar1 = util::BitUtil::findNextPowerOfTwo<unsigned_int>(initialLength);
  this->m_capacity = uVar1;
  this->m_limit = 0x20;
  __p = (uchar *)operator_new__((ulong)this->m_capacity);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&this->m_buffer,__p
            );
  return;
}

Assistant:

BufferBuilder(std::uint32_t initialLength) :
        m_capacity(BitUtil::findNextPowerOfTwo(initialLength)),
        m_limit(static_cast<std::uint32_t>(DataFrameHeader::LENGTH)),
        m_buffer(new std::uint8_t[m_capacity])
    {
    }